

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaBlockMetadata_TLSF::Clear(VmaBlockMetadata_TLSF *this)

{
  Block *pBVar1;
  RegionInfo *__s;
  Block *ptr;
  
  *(undefined8 *)((long)&this->m_BlocksFreeCount + 4) = 0;
  *(undefined8 *)((long)&this->m_BlocksFreeSize + 4) = 0;
  this->m_AllocCount = 0;
  this->m_BlocksFreeCount = 0;
  pBVar1 = this->m_NullBlock;
  pBVar1->offset = 0;
  pBVar1->size = (this->super_VmaBlockMetadata).m_Size;
  ptr = pBVar1->prevPhysical;
  pBVar1->prevPhysical = (Block *)0x0;
  while (ptr != (Block *)0x0) {
    pBVar1 = ptr->prevPhysical;
    VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Free(&this->m_BlockAllocator,ptr);
    ptr = pBVar1;
  }
  memset(this->m_FreeList,0,(ulong)this->m_ListsCount << 3);
  memset(this->m_InnerIsFreeBitmap,0,(ulong)this->m_MemoryClasses << 2);
  __s = (this->m_GranularityHandler).m_RegionInfo;
  if (__s != (RegionInfo *)0x0) {
    memset(__s,0,(ulong)(this->m_GranularityHandler).m_RegionCount << 2);
    return;
  }
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::Clear()
{
    m_AllocCount = 0;
    m_BlocksFreeCount = 0;
    m_BlocksFreeSize = 0;
    m_IsFreeBitmap = 0;
    m_NullBlock->offset = 0;
    m_NullBlock->size = GetSize();
    Block* block = m_NullBlock->prevPhysical;
    m_NullBlock->prevPhysical = VMA_NULL;
    while (block)
    {
        Block* prev = block->prevPhysical;
        m_BlockAllocator.Free(block);
        block = prev;
    }
    memset(m_FreeList, 0, m_ListsCount * sizeof(Block*));
    memset(m_InnerIsFreeBitmap, 0, m_MemoryClasses * sizeof(uint32_t));
    m_GranularityHandler.Clear();
}